

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O0

void ralloc_steal(void *new_ctx,void *ptr)

{
  ralloc_header *info_00;
  undefined8 local_30;
  ralloc_header *parent;
  ralloc_header *info;
  void *ptr_local;
  void *new_ctx_local;
  
  if (ptr != (void *)0x0) {
    info_00 = get_header(ptr);
    if (new_ctx == (void *)0x0) {
      local_30 = (ralloc_header *)0x0;
    }
    else {
      local_30 = get_header(new_ctx);
    }
    unlink_block(info_00);
    add_child(local_30,info_00);
  }
  return;
}

Assistant:

void
ralloc_steal(const void *new_ctx, void *ptr)
{
   ralloc_header *info, *parent;

   if (unlikely(ptr == NULL))
      return;

   info = get_header(ptr);
   parent = new_ctx ? get_header(new_ctx) : NULL;

   unlink_block(info);

   add_child(parent, info);
}